

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t attempts;
  char *pcVar1;
  typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> *ptVar2;
  typed_value<unsigned_long,_char> *this;
  size_type sVar3;
  ostream *poVar4;
  any *paVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  unsigned_long *puVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arities;
  variables_map vm;
  options_description description;
  allocator<char> local_199;
  basic_parsed_options<char> local_198;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_170;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_158;
  undefined8 local_138 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_128 [144];
  options_description local_98 [128];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,anon_var_dwarf_11fa2,(allocator<char> *)&local_198);
  boost::program_options::options_description::options_description
            (local_98,(string *)local_138,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)local_138);
  local_138[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_138,"help,h");
  ptVar2 = boost::program_options::value<std::vector<unsigned_long,std::allocator<unsigned_long>>>()
  ;
  ptVar2->m_multitoken = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"arity",(char *)ptVar2);
  this = boost::program_options::value<unsigned_long>();
  local_198.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8;
  boost::program_options::typed_value<unsigned_long,_char>::default_value
            (this,(unsigned_long *)&local_198);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"attempts");
  boost::program_options::variables_map::variables_map((variables_map *)local_138);
  local_158.super_function_base.vtable = (vtable_base *)0x0;
  local_158.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_158.super_function_base.functor._8_8_ = 0;
  local_158.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>(&local_198,argc,argv,local_98,0,&local_158);
  boost::program_options::store((basic_parsed_options *)&local_198,(variables_map *)local_138,false)
  ;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_198.options);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_158);
  boost::program_options::notify((variables_map *)local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"help",(allocator<char> *)&local_170);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_128,(key_type *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  if (sVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"arity",&local_199);
    paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_138);
    __x = boost::any_cast<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>(paVar5);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_170,__x);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"attempts",&local_199);
    paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_138);
    puVar6 = boost::any_cast<unsigned_long_const&>(paVar5);
    attempts = *puVar6;
    std::__cxx11::string::~string((string *)&local_198);
    test<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_170,attempts);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_170);
  }
  else {
    poVar4 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_98);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_138);
  boost::program_options::options_description::~options_description(local_98);
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка")
        ("arity", bpo::value<std::vector<std::size_t>>()->multitoken(), "Набор кратностей для испытаний")
        ("attempts", bpo::value<std::size_t>()->default_value(1000));

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            std::vector<std::size_t> arities = vm["arity"].as<std::vector<std::size_t>>();
            std::size_t attempts = vm["attempts"].as<std::size_t>();

            test(arities, attempts);
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}